

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void * db_compact_during_doc_delete(void *args)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  fdb_file_info *__n;
  fdb_file_info *kvs_config;
  void *__s2;
  ulong uVar5;
  char *pcVar6;
  fdb_doc *unaff_RBP;
  fdb_doc *pfVar7;
  char *pcVar8;
  fdb_file_info *info;
  fdb_kvs_handle *ptr_fhandle;
  fdb_kvs_handle *pfVar9;
  undefined1 handle [8];
  uint uVar10;
  fdb_kvs_handle *unaff_R12;
  long lVar11;
  char *unaff_R13;
  fdb_config *pfVar12;
  ulong uVar13;
  __atomic_base<unsigned_long> unaff_R15;
  timeval tVar14;
  timeval tVar15;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  pthread_t tid;
  void *thread_ret;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_14af0;
  undefined1 auStack_14ae8 [16];
  undefined1 auStack_14ad8 [8];
  undefined1 auStack_14ad0 [80];
  ulong uStack_14a80;
  timeval tStack_14a60;
  fdb_file_info afStack_14a50 [3];
  fdb_file_info afStack_14950 [3];
  fdb_config fStack_14850;
  fdb_kvs_handle *pfStack_14758;
  fdb_kvs_handle *pfStack_14750;
  char *pcStack_14748;
  fdb_config *pfStack_14740;
  list **pplStack_14738;
  fdb_doc *pfStack_14730;
  fdb_file_handle *pfStack_14720;
  fdb_kvs_handle *pfStack_14718;
  timeval tStack_14710;
  char acStack_146ff [15];
  timeval tStack_146f0;
  timeval tStack_146e0;
  undefined1 auStack_146d0 [70];
  undefined1 uStack_1468a;
  undefined8 uStack_14680;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_145c0;
  fdb_kvs_handle *pfStack_145b8;
  char *pcStack_145b0;
  fdb_kvs_handle *pfStack_145a8;
  list **pplStack_145a0;
  fdb_doc *pfStack_14598;
  undefined1 auStack_14580 [16];
  fdb_kvs_handle *pfStack_14570;
  fdb_doc *pfStack_14568;
  fdb_kvs_handle *pfStack_14560;
  fdb_kvs_handle *pfStack_14558;
  fdb_kvs_handle *pfStack_14550;
  fdb_kvs_config fStack_14548;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_14530;
  filemgr *pfStack_14528;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_14520;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_14518;
  filemgr *pfStack_14510;
  fdb_kvs_handle *pfStack_14508;
  timeval tStack_14500;
  undefined1 auStack_144f0 [256];
  __atomic_base<unsigned_long> _Stack_143f0;
  timeval tStack_143e8;
  __atomic_base<unsigned_long> _Stack_143d8;
  list *aplStack_14390 [32];
  char acStack_14290 [256];
  char acStack_14190 [256];
  fdb_doc afStack_14090 [1000];
  char acStack_810 [8];
  uint64_t *puStack_808;
  fdb_kvs_handle *pfStack_800;
  char *pcStack_7f8;
  fdb_kvs_handle *pfStack_7f0;
  list **pplStack_7e8;
  fdb_doc *pfStack_7e0;
  fdb_kvs_handle *local_7c8;
  fdb_kvs_handle *local_7c0;
  list *local_7b8;
  void *local_7b0;
  fdb_kvs_config local_7a8;
  fdb_kvs_info local_790;
  timeval local_760;
  undefined1 local_750 [760];
  char local_458 [256];
  fdb_doc *apfStack_358 [101];
  
  pfStack_7e0 = (fdb_doc *)0x10f937;
  gettimeofday(&local_760,(__timezone_ptr_t)0x0);
  pfStack_7e0 = (fdb_doc *)0x10f93c;
  memleak_start();
  pfStack_7e0 = (fdb_doc *)0x10f946;
  fdb_get_default_kvs_config();
  pfVar9 = (fdb_kvs_handle *)local_750;
  pfStack_7e0 = (fdb_doc *)0x10f956;
  fdb_get_default_config();
  local_750._8_8_ = (list *)0x0;
  local_750._16_8_ = (list *)0x400;
  local_750[0x2f] = '\0';
  if (args == (void *)0x0) {
    pfStack_7e0 = (fdb_doc *)0x10f980;
    system("rm -rf  compact_test* > errorlog.txt");
    ptr_fhandle = (fdb_kvs_handle *)&local_7c8;
    pfStack_7e0 = (fdb_doc *)0x10f999;
    fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)local_750);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_7e0 = (fdb_doc *)0x10f9b5;
      ptr_fhandle = local_7c8;
      fVar1 = fdb_kvs_open_default((fdb_file_handle *)local_7c8,&local_7c0,&local_7a8);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010fc6b;
      lVar11 = 0;
      uVar5 = 0;
      do {
        pfStack_7e0 = (fdb_doc *)0x10f9dd;
        sprintf(local_458,"key%d",uVar5 & 0xffffffff);
        pfStack_7e0 = (fdb_doc *)0x10f9f5;
        sprintf(local_750 + 0x1f8,"meta%d",uVar5 & 0xffffffff);
        pfStack_7e0 = (fdb_doc *)0x10fa0d;
        sprintf(local_750 + 0xf8,"body%d",uVar5 & 0xffffffff);
        pfStack_7e0 = (fdb_doc *)0x10fa20;
        unaff_R13 = (char *)strlen(local_458);
        unaff_RBP = (fdb_doc *)(local_750 + 0x1f8);
        pfStack_7e0 = (fdb_doc *)0x10fa33;
        sVar3 = strlen((char *)unaff_RBP);
        pfStack_7e0 = (fdb_doc *)0x10fa43;
        sVar4 = strlen(local_750 + 0xf8);
        pfStack_7e0 = (fdb_doc *)0x10fa68;
        fdb_doc_create((fdb_doc **)((long)apfStack_358 + lVar11),local_458,(size_t)unaff_R13,
                       unaff_RBP,sVar3,local_750 + 0xf8,sVar4);
        pfStack_7e0 = (fdb_doc *)0x10fa7a;
        fdb_set(local_7c0,apfStack_358[uVar5]);
        uVar5 = uVar5 + 1;
        lVar11 = lVar11 + 8;
      } while (uVar5 != 100);
      pfStack_7e0 = (fdb_doc *)0x10fa97;
      fdb_commit((fdb_file_handle *)local_7c8,'\0');
      pfStack_7e0 = (fdb_doc *)0x10faa6;
      fdb_get_kvs_info(local_7c0,&local_790);
      args = &local_790.doc_count;
      if ((filemgr *)local_790.doc_count != (filemgr *)0x64) {
        pfStack_7e0 = (fdb_doc *)0x10fab9;
        db_compact_during_doc_delete();
      }
      lVar11 = 0;
      unaff_R15._M_i = (__int_type_conflict)&local_7b8;
      do {
        pfStack_7e0 = (fdb_doc *)0x10fada;
        fdb_del(local_7c0,apfStack_358[lVar11]);
        if (lVar11 == 0x32) {
          pfStack_7e0 = (fdb_doc *)0x10faf2;
          pthread_create((pthread_t *)unaff_R15._M_i,(pthread_attr_t *)0x0,
                         db_compact_during_doc_delete,local_7c8);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 100);
      pfStack_7e0 = (fdb_doc *)0x10fb0a;
      pthread_join((pthread_t)local_7b8,&local_7b0);
      pfStack_7e0 = (fdb_doc *)0x10fb19;
      fdb_commit((fdb_file_handle *)local_7c8,'\x01');
      pfStack_7e0 = (fdb_doc *)0x10fb2b;
      fdb_get_kvs_info(local_7c0,&local_790);
      if ((filemgr *)local_790.doc_count != (filemgr *)0x0) {
        pfStack_7e0 = (fdb_doc *)0x10fb3a;
        db_compact_during_doc_delete();
      }
      pfStack_7e0 = (fdb_doc *)0x10fb44;
      fdb_kvs_close(local_7c0);
      pfVar9 = (fdb_kvs_handle *)&local_7c8;
      pfStack_7e0 = (fdb_doc *)0x10fb51;
      fdb_close((fdb_file_handle *)local_7c8);
      pfStack_7e0 = (fdb_doc *)0x10fb68;
      ptr_fhandle = pfVar9;
      fVar1 = fdb_open((fdb_file_handle **)pfVar9,"./compact_test1",(fdb_config *)local_750);
      unaff_R12 = (fdb_kvs_handle *)0x64;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010fc70;
      pfStack_7e0 = (fdb_doc *)0x10fb84;
      ptr_fhandle = local_7c8;
      fVar1 = fdb_kvs_open_default((fdb_file_handle *)local_7c8,&local_7c0,&local_7a8);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pfStack_7e0 = (fdb_doc *)0x10fb9e;
        fdb_get_kvs_info(local_7c0,&local_790);
        if ((filemgr *)local_790.doc_count != (filemgr *)0x0) {
          pfStack_7e0 = (fdb_doc *)0x10fbad;
          db_compact_during_doc_delete();
        }
        lVar11 = 0;
        do {
          pfStack_7e0 = (fdb_doc *)0x10fbbc;
          fdb_doc_free(apfStack_358[lVar11]);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 100);
        pfStack_7e0 = (fdb_doc *)0x10fbcf;
        fdb_kvs_close(local_7c0);
        pfStack_7e0 = (fdb_doc *)0x10fbd9;
        fdb_close((fdb_file_handle *)local_7c8);
        pfStack_7e0 = (fdb_doc *)0x10fbde;
        fdb_shutdown();
        pfStack_7e0 = (fdb_doc *)0x10fbe3;
        memleak_end();
        pcVar8 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        pfStack_7e0 = (fdb_doc *)0x10fc14;
        fprintf(_stderr,pcVar8,"multi thread client shutdown");
        return (void *)0x0;
      }
    }
    else {
      pfStack_7e0 = (fdb_doc *)0x10fc6b;
      db_compact_during_doc_delete();
LAB_0010fc6b:
      pfStack_7e0 = (fdb_doc *)0x10fc70;
      db_compact_during_doc_delete();
LAB_0010fc70:
      pfStack_7e0 = (fdb_doc *)0x10fc75;
      db_compact_during_doc_delete();
    }
    pfStack_7e0 = (fdb_doc *)0x10fc7a;
    db_compact_during_doc_delete();
LAB_0010fc7a:
    pfStack_7e0 = (fdb_doc *)0x10fc7f;
    db_compact_during_doc_delete();
  }
  else {
    ptr_fhandle = (fdb_kvs_handle *)&local_7c8;
    pfStack_7e0 = (fdb_doc *)0x10fc41;
    fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)local_750);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010fc7a;
    pfStack_7e0 = (fdb_doc *)0x10fc51;
    ptr_fhandle = local_7c8;
    fVar1 = fdb_compact((fdb_file_handle *)local_7c8,(char *)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_7e0 = (fdb_doc *)0x10fc5f;
      fdb_close((fdb_file_handle *)local_7c8);
      pfStack_7e0 = (fdb_doc *)0x10fc66;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_7e0 = (fdb_doc *)compaction_daemon_test;
  db_compact_during_doc_delete();
  pcVar6 = (char *)0x0;
  pfStack_14598 = (fdb_doc *)0x10fcab;
  pfStack_14550 = ptr_fhandle;
  puStack_808 = (uint64_t *)args;
  pfStack_800 = unaff_R12;
  pcStack_7f8 = unaff_R13;
  pfStack_7f0 = pfVar9;
  pplStack_7e8 = (list **)unaff_R15._M_i;
  pfStack_7e0 = unaff_RBP;
  gettimeofday(&tStack_143e8,(__timezone_ptr_t)0x0);
  pfStack_14598 = (fdb_doc *)0x10fcb0;
  memleak_start();
  pfStack_14598 = (fdb_doc *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar9 = (fdb_kvs_handle *)auStack_144f0;
  pfStack_14598 = (fdb_doc *)0x10fccc;
  fdb_get_default_config();
  pfStack_14598 = (fdb_doc *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_144f0._8_8_ = (kvs_ops_stat *)0x0;
  auStack_144f0._16_8_ = (fdb_file_handle *)0x400;
  auStack_144f0._36_4_ = 1;
  auStack_144f0._46_2_ = 0x1e01;
  auStack_144f0._56_8_ = (docio_handle *)0x1;
  auStack_144f0._120_8_ = 0;
  pcVar8 = auStack_14580;
  pfStack_14598 = (fdb_doc *)0x10fd11;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test",(fdb_config *)pfVar9);
  if (fVar1 != FDB_RESULT_INVALID_CONFIG) goto LAB_0011080b;
  auStack_144f0._120_8_ = 4;
  pfStack_14598 = (fdb_doc *)0x10fd3e;
  fdb_open((fdb_file_handle **)auStack_14580,"compact_test",(fdb_config *)auStack_144f0);
  pfVar9 = (fdb_kvs_handle *)(auStack_14580 + 8);
  pfStack_14598 = (fdb_doc *)0x10fd53;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_14580._0_8_,(fdb_kvs_handle **)pfVar9,&fStack_14548);
  pfStack_14598 = (fdb_doc *)0x10fd69;
  pcVar8 = (char *)auStack_14580._8_8_;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14580._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110810;
  pfStack_14598 = (fdb_doc *)0x10fd7d;
  puts("Initialize..");
  pcVar6 = (char *)0x0;
  uVar5 = 0;
  do {
    pfStack_14598 = (fdb_doc *)0x10fd9e;
    sprintf((char *)aplStack_14390,"key%04d",uVar5 & 0xffffffff);
    pfStack_14598 = (fdb_doc *)0x10fdba;
    sprintf(acStack_14290,"meta%04d",uVar5 & 0xffffffff);
    pfStack_14598 = (fdb_doc *)0x10fdd6;
    sprintf(acStack_14190,"body%04d",uVar5 & 0xffffffff);
    unaff_RBP = (fdb_doc *)((long)&afStack_14090[0].keylen + (long)pcVar6);
    pfStack_14598 = (fdb_doc *)0x10fde9;
    sVar3 = strlen((char *)aplStack_14390);
    unaff_R15._M_i = sVar3 + 1;
    pfStack_14598 = (fdb_doc *)0x10fdf5;
    sVar3 = strlen(acStack_14290);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_14598 = (fdb_doc *)0x10fe01;
    sVar3 = strlen(acStack_14190);
    pfStack_14598 = (fdb_doc *)0x10fe29;
    fdb_doc_create((fdb_doc **)unaff_RBP,aplStack_14390,unaff_R15._M_i,acStack_14290,
                   (size_t)unaff_R13,acStack_14190,sVar3 + 1);
    pfStack_14598 = (fdb_doc *)0x10fe3b;
    fdb_set((fdb_kvs_handle *)auStack_14580._8_8_,(fdb_doc *)(&afStack_14090[0].keylen)[uVar5]);
    uVar5 = uVar5 + 1;
    pcVar6 = (char *)((long)pcVar6 + 8);
  } while (uVar5 != 10000);
  pfVar9 = (fdb_kvs_handle *)auStack_14580;
  pfStack_14598 = (fdb_doc *)0x10fe5e;
  fdb_commit((fdb_file_handle *)auStack_14580._0_8_,'\0');
  pfStack_14598 = (fdb_doc *)0x10fe66;
  fdb_close((fdb_file_handle *)auStack_14580._0_8_);
  pfStack_14598 = (fdb_doc *)0x10fe7d;
  pcVar8 = (char *)pfVar9;
  fVar1 = fdb_open((fdb_file_handle **)pfVar9,"compact_test",(fdb_config *)auStack_144f0);
  unaff_R12 = (fdb_kvs_handle *)0x2710;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110815;
  pfStack_14598 = (fdb_doc *)0x10fe99;
  pcVar8 = (char *)auStack_14580._0_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14580._0_8_,(fdb_kvs_handle **)(auStack_14580 + 8),
                     &fStack_14548);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
  pfStack_14598 = (fdb_doc *)0x10feb9;
  pcVar8 = (char *)auStack_14580._8_8_;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14580._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
  pfVar9 = (fdb_kvs_handle *)&_Stack_143d8;
  pfStack_14598 = (fdb_doc *)0x10fed6;
  fdb_get_file_info((fdb_file_handle *)auStack_14580._0_8_,(fdb_file_info *)pfVar9);
  pfStack_14598 = (fdb_doc *)0x10fee5;
  iVar2 = strcmp((char *)_Stack_143d8._M_i,"compact_test");
  if (iVar2 != 0) {
    pfStack_14598 = (fdb_doc *)0x10fef6;
    compaction_daemon_test();
  }
  pcVar6 = "key%04d";
  unaff_R15._M_i = (__int_type_conflict)aplStack_14390;
  unaff_R13 = (char *)0x0;
  pfVar7 = unaff_RBP;
  do {
    pfStack_14598 = (fdb_doc *)0x10ff18;
    sprintf((char *)unaff_R15._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_14598 = (fdb_doc *)0x10ff20;
    sVar3 = strlen((char *)unaff_R15._M_i);
    pfStack_14598 = (fdb_doc *)0x10ff41;
    fdb_doc_create(&pfStack_14568,(void *)unaff_R15._M_i,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_14598 = (fdb_doc *)0x10ff50;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_14580._8_8_,pfStack_14568);
    unaff_RBP = pfStack_14568;
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
      pfStack_14598 = (fdb_doc *)0x1107eb;
      compaction_daemon_test();
      goto LAB_001107eb;
    }
    pfVar9 = (fdb_kvs_handle *)pfStack_14568->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_14090[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_14598 = (fdb_doc *)0x10ff7c;
    iVar2 = bcmp(pfVar9,unaff_R12,pfStack_14568->bodylen);
    pfVar7 = unaff_RBP;
    if (iVar2 != 0) {
      pfStack_14598 = (fdb_doc *)0x1107e6;
      compaction_daemon_test();
      goto LAB_001107e6;
    }
    pfStack_14598 = (fdb_doc *)0x10ff8c;
    fdb_doc_free(unaff_RBP);
    unaff_R13 = unaff_R13 + 1;
  } while (unaff_R13 != (char *)0x2710);
  pfStack_14598 = (fdb_doc *)0x10ffb0;
  pcVar8 = (char *)auStack_14580._8_8_;
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)auStack_14580._8_8_,(fdb_kvs_handle **)&pfStack_14528,
                            10000);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110824;
  pfStack_14598 = (fdb_doc *)0x10ffc2;
  fdb_kvs_close((fdb_kvs_handle *)pfStack_14528);
  pfVar9 = (fdb_kvs_handle *)auStack_14580;
  pfStack_14598 = (fdb_doc *)0x10ffcf;
  fdb_close((fdb_file_handle *)auStack_14580._0_8_);
  pfStack_14598 = (fdb_doc *)0x10ffdb;
  system("rm -rf  compact_test.meta > errorlog.txt");
  pfStack_14598 = (fdb_doc *)0x10fff2;
  pcVar8 = (char *)pfVar9;
  fVar1 = fdb_open((fdb_file_handle **)pfVar9,"compact_test",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110829;
  pfStack_14598 = (fdb_doc *)0x11000e;
  pcVar8 = (char *)auStack_14580._0_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14580._0_8_,(fdb_kvs_handle **)(auStack_14580 + 8),
                     &fStack_14548);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
  pfStack_14598 = (fdb_doc *)0x11002e;
  pcVar8 = (char *)auStack_14580._8_8_;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14580._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110833;
  pcVar6 = "key%04d";
  unaff_R15._M_i = (__int_type_conflict)aplStack_14390;
  unaff_R13 = (char *)0x0;
  do {
    pfStack_14598 = (fdb_doc *)0x110058;
    sprintf((char *)unaff_R15._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_14598 = (fdb_doc *)0x110060;
    sVar3 = strlen((char *)unaff_R15._M_i);
    pfStack_14598 = (fdb_doc *)0x110081;
    fdb_doc_create(&pfStack_14568,(void *)unaff_R15._M_i,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_14598 = (fdb_doc *)0x110090;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_14580._8_8_,pfStack_14568);
    pfVar7 = pfStack_14568;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
    pfVar9 = (fdb_kvs_handle *)pfStack_14568->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_14090[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_14598 = (fdb_doc *)0x1100bc;
    iVar2 = bcmp(pfVar9,unaff_R12,pfStack_14568->bodylen);
    if (iVar2 != 0) goto LAB_001107eb;
    pfStack_14598 = (fdb_doc *)0x1100cc;
    fdb_doc_free(pfVar7);
    unaff_R13 = unaff_R13 + 1;
    unaff_RBP = pfVar7;
  } while (unaff_R13 != (char *)0x2710);
  pfVar9 = (fdb_kvs_handle *)auStack_14580;
  pfStack_14598 = (fdb_doc *)0x1100e9;
  fdb_close((fdb_file_handle *)auStack_14580._0_8_);
  pfStack_14598 = (fdb_doc *)0x1100f5;
  system("mv  compact_test.0 compact_test.23 > errorlog.txt");
  pfStack_14598 = (fdb_doc *)0x11010c;
  pcVar8 = (char *)pfVar9;
  fVar1 = fdb_open((fdb_file_handle **)pfVar9,"compact_test",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110838;
  pfStack_14598 = (fdb_doc *)0x110128;
  pcVar8 = (char *)auStack_14580._0_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14580._0_8_,(fdb_kvs_handle **)(auStack_14580 + 8),
                     &fStack_14548);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
  pfStack_14598 = (fdb_doc *)0x110148;
  pcVar8 = (char *)auStack_14580._8_8_;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14580._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110842;
  pcVar6 = "key%04d";
  unaff_R15._M_i = (__int_type_conflict)aplStack_14390;
  unaff_R13 = (char *)0x0;
  do {
    pfStack_14598 = (fdb_doc *)0x110172;
    sprintf((char *)unaff_R15._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_14598 = (fdb_doc *)0x11017a;
    sVar3 = strlen((char *)unaff_R15._M_i);
    pfStack_14598 = (fdb_doc *)0x11019b;
    fdb_doc_create(&pfStack_14568,(void *)unaff_R15._M_i,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_14598 = (fdb_doc *)0x1101aa;
    pcVar8 = (char *)auStack_14580._8_8_;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_14580._8_8_,pfStack_14568);
    pfVar7 = pfStack_14568;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110806;
    pfVar9 = (fdb_kvs_handle *)pfStack_14568->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_14090[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_14598 = (fdb_doc *)0x1101d6;
    iVar2 = bcmp(pfVar9,unaff_R12,pfStack_14568->bodylen);
    if (iVar2 != 0) goto LAB_001107fb;
    pfStack_14598 = (fdb_doc *)0x1101e6;
    fdb_doc_free(pfVar7);
    unaff_R13 = unaff_R13 + 1;
    unaff_RBP = pfVar7;
  } while (unaff_R13 != (char *)0x2710);
  pfStack_14598 = (fdb_doc *)0x110200;
  fdb_close((fdb_file_handle *)auStack_14580._0_8_);
  pcVar8 = (char *)&pfStack_14558;
  pfStack_14598 = (fdb_doc *)0x110219;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_less",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110847;
  pfStack_14598 = (fdb_doc *)0x110238;
  pcVar8 = (char *)pfStack_14558;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_14558,(fdb_kvs_handle **)&pfStack_14510,
                     &fStack_14548);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
  auStack_144f0._46_2_ = auStack_144f0._46_2_ & 0xff;
  pcVar8 = (char *)&pfStack_14560;
  pfStack_14598 = (fdb_doc *)0x11025d;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_non",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110851;
  pfStack_14598 = (fdb_doc *)0x110279;
  pcVar8 = (char *)pfStack_14560;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_14560,(fdb_kvs_handle **)&aStack_14518.seqtree,
                     &fStack_14548);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110856;
  auStack_144f0._46_2_ = auStack_144f0._46_2_ & 0xff00;
  pcVar8 = (char *)&pfStack_14570;
  pfStack_14598 = (fdb_doc *)0x11029e;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_manual",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
  pfStack_14598 = (fdb_doc *)0x1102ba;
  pcVar8 = (char *)pfStack_14570;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_14570,(fdb_kvs_handle **)&aStack_14520.seqtree,
                     &fStack_14548);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110860;
  auStack_144f0._46_2_ = 0x1e01;
  pcVar8 = auStack_14580;
  pfStack_14598 = (fdb_doc *)0x1102e1;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110865;
  pfStack_14598 = (fdb_doc *)0x1102fd;
  pcVar8 = (char *)auStack_14580._0_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14580._0_8_,(fdb_kvs_handle **)(auStack_14580 + 8),
                     &fStack_14548);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
  pfStack_14598 = (fdb_doc *)0x11031d;
  pcVar8 = (char *)auStack_14580._8_8_;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14580._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
  pcVar6 = (char *)0x0;
  pfStack_14598 = (fdb_doc *)0x11033a;
  printf("wait for %d seconds..\n");
  pfStack_14598 = (fdb_doc *)0x11034c;
  gettimeofday((timeval *)(auStack_144f0 + 0xf8),(__timezone_ptr_t)0x0);
  tVar15.tv_usec = _Stack_143f0._M_i;
  tVar15.tv_sec = auStack_144f0._248_8_;
  do {
    pfVar7 = (fdb_doc *)0xfffffffffffec780;
    unaff_R13 = (char *)0x0;
    iVar2 = 0;
    aStack_14530 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar6;
    do {
      pfStack_14598 = (fdb_doc *)0x110388;
      fdb_set((fdb_kvs_handle *)auStack_14580._8_8_,*(fdb_doc **)(acStack_810 + (long)pfVar7));
      pfStack_14598 = (fdb_doc *)0x110394;
      fdb_commit((fdb_file_handle *)auStack_14580._0_8_,'\0');
      uVar10 = (int)((ulong)unaff_R13 / 100) * 100 + iVar2;
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar10;
      if (uVar10 == 0) {
        pfStack_14598 = (fdb_doc *)0x1103ae;
        fdb_set((fdb_kvs_handle *)pfStack_14510,*(fdb_doc **)(acStack_810 + (long)pfVar7));
        pfStack_14598 = (fdb_doc *)0x1103ba;
        fdb_commit((fdb_file_handle *)pfStack_14558,'\0');
      }
      pfStack_14598 = (fdb_doc *)0x1103cc;
      fdb_set((fdb_kvs_handle *)aStack_14518.seqtree,*(fdb_doc **)(acStack_810 + (long)pfVar7));
      pfStack_14598 = (fdb_doc *)0x1103d8;
      fdb_commit((fdb_file_handle *)pfStack_14560,'\0');
      pfStack_14598 = (fdb_doc *)0x1103ea;
      fdb_set((fdb_kvs_handle *)aStack_14520.seqtree,*(fdb_doc **)(acStack_810 + (long)pfVar7));
      pfStack_14598 = (fdb_doc *)0x1103f6;
      fdb_commit((fdb_file_handle *)pfStack_14570,'\0');
      pfStack_14598 = (fdb_doc *)0x110405;
      gettimeofday((timeval *)&tStack_14500,(__timezone_ptr_t)0x0);
      pfStack_14598 = (fdb_doc *)0x110420;
      tVar14 = _utime_gap(tVar15,tStack_14500);
      if (pfStack_14550 <= (fdb_kvs_handle *)tVar14.tv_sec) {
        pcVar6 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
        break;
      }
      iVar2 = iVar2 + -1;
      unaff_R13 = (char *)(ulong)((int)unaff_R13 + 1);
      pfVar7 = (fdb_doc *)&pfVar7->metalen;
      pcVar6 = (char *)aStack_14530;
    } while (pfVar7 != (fdb_doc *)0x0);
  } while ((int)pcVar6 == 0);
  pfStack_14598 = (fdb_doc *)0x110459;
  pcVar8 = (char *)auStack_14580._0_8_;
  fVar1 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_14580._0_8_,0x3c);
  pfVar9 = (fdb_kvs_handle *)auStack_144f0._248_8_;
  unaff_R15._M_i = _Stack_143f0._M_i;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110874;
  pfStack_14598 = (fdb_doc *)0x110470;
  pcVar8 = (char *)auStack_14580._0_8_;
  fVar1 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_14580._0_8_,1);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110879;
  pfStack_14598 = (fdb_doc *)0x110484;
  pcVar8 = (char *)pfStack_14560;
  fVar1 = fdb_compact((fdb_file_handle *)pfStack_14560,(char *)0x0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
  pfStack_14598 = (fdb_doc *)0x11049d;
  pcVar8 = (char *)pfStack_14570;
  fVar1 = fdb_compact((fdb_file_handle *)pfStack_14570,"compact_test_manual_compacted");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110883;
  auStack_144f0._46_2_ = auStack_144f0._46_2_ & 0xff00;
  pcVar8 = (char *)&pfStack_14508;
  pfStack_14598 = (fdb_doc *)0x1104c5;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_manual_compacted",
                   (fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110888;
  pfStack_14598 = (fdb_doc *)0x1104e1;
  pcVar8 = (char *)pfStack_14570;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_14570,'\x01',0x1e);
  if (fVar1 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
  pfStack_14598 = (fdb_doc *)0x1104f7;
  fVar1 = fdb_close((fdb_file_handle *)pfStack_14508);
  pcVar8 = (char *)pfStack_14508;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110892;
  pfStack_14598 = (fdb_doc *)0x110513;
  pcVar8 = (char *)pfStack_14570;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_14570,'\x01',10);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110897;
  pfStack_14598 = (fdb_doc *)0x11052f;
  pcVar8 = (char *)pfStack_14570;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_14570,'\x01',0x1e);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
  pfStack_14598 = (fdb_doc *)0x110541;
  pcVar8 = (char *)pfStack_14570;
  fVar1 = fdb_close((fdb_file_handle *)pfStack_14570);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
  auStack_144f0[0x2e] = 1;
  pcVar8 = (char *)&pfStack_14570;
  pfStack_14598 = (fdb_doc *)0x110566;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_manual_compacted",
                   (fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
  pfStack_14598 = (fdb_doc *)0x11057c;
  pcVar8 = (char *)pfStack_14560;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_14560,'\0',0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
  pfStack_14598 = (fdb_doc *)0x11058e;
  pcVar8 = (char *)pfStack_14560;
  fVar1 = fdb_close((fdb_file_handle *)pfStack_14560);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
  auStack_144f0._46_2_ = auStack_144f0._46_2_ & 0xff00;
  pcVar8 = (char *)&pfStack_14560;
  pfStack_14598 = (fdb_doc *)0x1105b3;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_non",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
  pcVar6 = "compact_test_non.manual";
  pfStack_14598 = (fdb_doc *)0x1105cf;
  fdb_compact((fdb_file_handle *)pfStack_14560,"compact_test_non.manual");
  pfVar9 = (fdb_kvs_handle *)auStack_14580;
  pfStack_14598 = (fdb_doc *)0x1105dc;
  fdb_close((fdb_file_handle *)auStack_14580._0_8_);
  pfStack_14598 = (fdb_doc *)0x1105e6;
  fdb_close((fdb_file_handle *)pfStack_14558);
  pfStack_14598 = (fdb_doc *)0x1105f0;
  fdb_close((fdb_file_handle *)pfStack_14570);
  auStack_144f0[0x2e] = 1;
  pfStack_14598 = (fdb_doc *)0x110607;
  pcVar8 = (char *)pfVar9;
  fVar1 = fdb_open((fdb_file_handle **)pfVar9,"compact_test_non.manual",(fdb_config *)auStack_144f0)
  ;
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
  pcVar8 = "compact_test_non.manual";
  pfStack_14598 = (fdb_doc *)0x110624;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
  auStack_144f0._46_2_ = auStack_144f0._46_2_ & 0xff00;
  pcVar8 = auStack_14580;
  pfStack_14598 = (fdb_doc *)0x11064a;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_manual_compacted",
                   (fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
  pcVar8 = "compact_test_manual_compacted";
  pfStack_14598 = (fdb_doc *)0x110667;
  fVar1 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
  auStack_144f0[0x2e] = 1;
  pcVar8 = "compact_test_manual_compacted";
  pfStack_14598 = (fdb_doc *)0x110688;
  fVar1 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
  auStack_144f0._46_2_ = auStack_144f0._46_2_ & 0xff00;
  pcVar8 = "compact_test_non.manual";
  pfStack_14598 = (fdb_doc *)0x1106a8;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
  pfStack_14598 = (fdb_doc *)0x1106bb;
  fdb_close((fdb_file_handle *)pfStack_14560);
  pfStack_14598 = (fdb_doc *)0x1106c0;
  fVar1 = fdb_shutdown();
  pcVar8 = (char *)pfStack_14560;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
  pcVar8 = "compact_test_non.manual";
  pfStack_14598 = (fdb_doc *)0x1106dc;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
  auStack_144f0._36_4_ = 2;
  pcVar8 = auStack_14580;
  pfStack_14598 = (fdb_doc *)0x110704;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"./compact_test_manual_compacted",
                   (fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
  pcVar8 = auStack_14580;
  pfStack_14598 = (fdb_doc *)0x110726;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"./compact_test_manual_compacted.meta",
                   (fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
  pcVar8 = auStack_14580;
  pfStack_14598 = (fdb_doc *)0x110748;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_non",(fdb_config *)auStack_144f0);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
  pcVar8 = auStack_14580;
  pfStack_14598 = (fdb_doc *)0x11076a;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_non.manual",(fdb_config *)auStack_144f0)
  ;
  if (fVar1 == FDB_RESULT_NO_SUCH_FILE) {
    lVar11 = 0;
    do {
      pfStack_14598 = (fdb_doc *)0x110782;
      fdb_doc_free((fdb_doc *)(&afStack_14090[0].keylen)[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 10000);
    pfStack_14598 = (fdb_doc *)0x110793;
    fdb_shutdown();
    pfStack_14598 = (fdb_doc *)0x110798;
    memleak_end();
    pcVar8 = "%s PASSED\n";
    if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
      pcVar8 = "%s FAILED\n";
    }
    pfStack_14598 = (fdb_doc *)0x1107c9;
    iVar2 = fprintf(_stderr,pcVar8,"compaction daemon test");
    return (void *)CONCAT44(extraout_var,iVar2);
  }
  goto LAB_001108f1;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
LAB_001107eb:
  pfStack_14598 = (fdb_doc *)0x1107f6;
  compaction_daemon_test();
  unaff_RBP = pfVar7;
LAB_001107f6:
  pfVar7 = unaff_RBP;
  pfStack_14598 = (fdb_doc *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_14598 = (fdb_doc *)0x110806;
  pcVar8 = (char *)unaff_R12;
  compaction_daemon_test();
  unaff_RBP = pfVar7;
LAB_00110806:
  unaff_R15._M_i = (__int_type_conflict)aplStack_14390;
  pcVar6 = "key%04d";
  pfStack_14598 = (fdb_doc *)0x11080b;
  compaction_daemon_test();
LAB_0011080b:
  pfStack_14598 = (fdb_doc *)0x110810;
  compaction_daemon_test();
LAB_00110810:
  pfStack_14598 = (fdb_doc *)0x110815;
  compaction_daemon_test();
LAB_00110815:
  pfStack_14598 = (fdb_doc *)0x11081a;
  compaction_daemon_test();
LAB_0011081a:
  pfStack_14598 = (fdb_doc *)0x11081f;
  compaction_daemon_test();
LAB_0011081f:
  pfStack_14598 = (fdb_doc *)0x110824;
  compaction_daemon_test();
LAB_00110824:
  pfStack_14598 = (fdb_doc *)0x110829;
  compaction_daemon_test();
LAB_00110829:
  pfStack_14598 = (fdb_doc *)0x11082e;
  compaction_daemon_test();
LAB_0011082e:
  pfStack_14598 = (fdb_doc *)0x110833;
  compaction_daemon_test();
  pfVar7 = unaff_RBP;
LAB_00110833:
  pfStack_14598 = (fdb_doc *)0x110838;
  compaction_daemon_test();
LAB_00110838:
  pfStack_14598 = (fdb_doc *)0x11083d;
  compaction_daemon_test();
LAB_0011083d:
  pfStack_14598 = (fdb_doc *)0x110842;
  compaction_daemon_test();
LAB_00110842:
  pfStack_14598 = (fdb_doc *)0x110847;
  compaction_daemon_test();
LAB_00110847:
  pfStack_14598 = (fdb_doc *)0x11084c;
  compaction_daemon_test();
LAB_0011084c:
  pfStack_14598 = (fdb_doc *)0x110851;
  compaction_daemon_test();
LAB_00110851:
  pfStack_14598 = (fdb_doc *)0x110856;
  compaction_daemon_test();
LAB_00110856:
  pfStack_14598 = (fdb_doc *)0x11085b;
  compaction_daemon_test();
LAB_0011085b:
  pfStack_14598 = (fdb_doc *)0x110860;
  compaction_daemon_test();
LAB_00110860:
  pfStack_14598 = (fdb_doc *)0x110865;
  compaction_daemon_test();
LAB_00110865:
  pfStack_14598 = (fdb_doc *)0x11086a;
  compaction_daemon_test();
LAB_0011086a:
  pfStack_14598 = (fdb_doc *)0x11086f;
  compaction_daemon_test();
LAB_0011086f:
  pfStack_14598 = (fdb_doc *)0x110874;
  compaction_daemon_test();
LAB_00110874:
  pfStack_14598 = (fdb_doc *)0x110879;
  compaction_daemon_test();
LAB_00110879:
  pfStack_14598 = (fdb_doc *)0x11087e;
  compaction_daemon_test();
LAB_0011087e:
  pfStack_14598 = (fdb_doc *)0x110883;
  compaction_daemon_test();
LAB_00110883:
  pfStack_14598 = (fdb_doc *)0x110888;
  compaction_daemon_test();
LAB_00110888:
  pfStack_14598 = (fdb_doc *)0x11088d;
  compaction_daemon_test();
LAB_0011088d:
  pfStack_14598 = (fdb_doc *)0x110892;
  compaction_daemon_test();
LAB_00110892:
  pfStack_14598 = (fdb_doc *)0x110897;
  compaction_daemon_test();
LAB_00110897:
  pfStack_14598 = (fdb_doc *)0x11089c;
  compaction_daemon_test();
LAB_0011089c:
  pfStack_14598 = (fdb_doc *)0x1108a1;
  compaction_daemon_test();
LAB_001108a1:
  pfStack_14598 = (fdb_doc *)0x1108a6;
  compaction_daemon_test();
LAB_001108a6:
  pfStack_14598 = (fdb_doc *)0x1108ab;
  compaction_daemon_test();
LAB_001108ab:
  pfStack_14598 = (fdb_doc *)0x1108b0;
  compaction_daemon_test();
LAB_001108b0:
  pfStack_14598 = (fdb_doc *)0x1108b5;
  compaction_daemon_test();
LAB_001108b5:
  pfStack_14598 = (fdb_doc *)0x1108ba;
  compaction_daemon_test();
LAB_001108ba:
  pfStack_14598 = (fdb_doc *)0x1108bf;
  compaction_daemon_test();
LAB_001108bf:
  pfStack_14598 = (fdb_doc *)0x1108c4;
  compaction_daemon_test();
LAB_001108c4:
  pfStack_14598 = (fdb_doc *)0x1108c9;
  compaction_daemon_test();
LAB_001108c9:
  pfStack_14598 = (fdb_doc *)0x1108ce;
  compaction_daemon_test();
LAB_001108ce:
  pfStack_14598 = (fdb_doc *)0x1108d3;
  compaction_daemon_test();
LAB_001108d3:
  pfStack_14598 = (fdb_doc *)0x1108d8;
  compaction_daemon_test();
LAB_001108d8:
  pfStack_14598 = (fdb_doc *)0x1108dd;
  compaction_daemon_test();
LAB_001108dd:
  pfStack_14598 = (fdb_doc *)0x1108e2;
  compaction_daemon_test();
LAB_001108e2:
  pfStack_14598 = (fdb_doc *)0x1108e7;
  compaction_daemon_test();
LAB_001108e7:
  pfStack_14598 = (fdb_doc *)0x1108ec;
  compaction_daemon_test();
LAB_001108ec:
  pfStack_14598 = (fdb_doc *)0x1108f1;
  compaction_daemon_test();
LAB_001108f1:
  pfStack_14598 = (fdb_doc *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_14730 = (fdb_doc *)0x110916;
  aStack_145c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar6;
  pfStack_145b8 = unaff_R12;
  pcStack_145b0 = unaff_R13;
  pfStack_145a8 = pfVar9;
  pplStack_145a0 = (list **)unaff_R15._M_i;
  pfStack_14598 = pfVar7;
  gettimeofday(&tStack_146e0,(__timezone_ptr_t)0x0);
  pfStack_14730 = (fdb_doc *)0x11091b;
  memleak_start();
  pfStack_14730 = (fdb_doc *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_14730 = (fdb_doc *)0x110934;
  fdb_get_default_config();
  uStack_1468a = 1;
  uStack_14680._0_2_ = 1;
  uStack_14680._2_2_ = 0;
  uStack_14680._4_4_ = 0;
  pfStack_14730 = (fdb_doc *)0x110955;
  fVar1 = fdb_open(&pfStack_14720,"compact_test",(fdb_config *)(auStack_146d0 + 0x18));
  pfVar12 = (fdb_config *)(auStack_146d0 + 0x18);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar12 = (fdb_config *)auStack_146d0;
    pfStack_14730 = (fdb_doc *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_14730 = (fdb_doc *)0x11097c;
    fVar1 = fdb_kvs_open_default(pfStack_14720,&pfStack_14718,(fdb_kvs_config *)pfVar12);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_14730 = (fdb_doc *)0x110993;
    gettimeofday(&tStack_146f0,(__timezone_ptr_t)0x0);
    pfStack_14730 = (fdb_doc *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar8 & 0xffffffff);
    tVar14.tv_usec = tStack_146f0.tv_usec;
    tVar14.tv_sec = tStack_146f0.tv_sec;
    unaff_R13 = acStack_146ff;
    pfVar7 = (fdb_doc *)0x0;
    do {
      iVar2 = (int)pfVar7;
      pfStack_14730 = (fdb_doc *)0x1109c4;
      sprintf(unaff_R13,"%d",pfVar7);
      unaff_R12 = pfStack_14718;
      pfStack_14730 = (fdb_doc *)0x1109d1;
      sVar3 = strlen(unaff_R13);
      pfStack_14730 = (fdb_doc *)0x1109ec;
      fVar1 = fdb_set_kv(unaff_R12,unaff_R13,sVar3,"value",5);
      pfVar12 = (fdb_config *)tStack_146f0.tv_sec;
      unaff_R15._M_i = tStack_146f0.tv_usec;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_14730 = (fdb_doc *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_14730 = (fdb_doc *)0x110a00;
      fVar1 = fdb_commit(pfStack_14720,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_14730 = (fdb_doc *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_14730 = (fdb_doc *)0x110a14;
      gettimeofday((timeval *)&tStack_14710,(__timezone_ptr_t)0x0);
      pfStack_14730 = (fdb_doc *)0x110a29;
      tVar15 = _utime_gap(tVar14,tStack_14710);
    } while (((fdb_kvs_handle *)tVar15.tv_sec < pcVar8) &&
            (pfVar7 = (fdb_doc *)(ulong)(iVar2 + 1), iVar2 != 99999));
    pfStack_14730 = (fdb_doc *)0x110a49;
    fVar1 = fdb_close(pfStack_14720);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_14730 = (fdb_doc *)0x110a52;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_14730 = (fdb_doc *)0x110a5b;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_14730 = (fdb_doc *)0x110a8c;
      iVar2 = fprintf(_stderr,pcVar8,"auto compaction with concurrent insert test");
      return (void *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  else {
LAB_00110aa8:
    pfStack_14730 = (fdb_doc *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_14730 = (fdb_doc *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_14730 = (fdb_doc *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_14730 = (fdb_doc *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_14758 = (fdb_kvs_handle *)pcVar8;
  pfStack_14750 = unaff_R12;
  pcStack_14748 = unaff_R13;
  pfStack_14740 = pfVar12;
  pplStack_14738 = (list **)unaff_R15._M_i;
  pfStack_14730 = pfVar7;
  gettimeofday(&tStack_14a60,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_14ad0._32_8_ = (btree *)0x0;
  auStack_14ad0._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_14850.wal_threshold = 0x1000;
  fStack_14850.compaction_mode = '\x01';
  fStack_14850.compaction_threshold = '\n';
  fStack_14850.compactor_sleep_duration = 1;
  info = (fdb_file_info *)0x14e0c5;
  pfVar9 = (fdb_kvs_handle *)&pfStack_14af0;
  kvs_config = (fdb_file_info *)0x1;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)pfVar9,"compact_test",&fStack_14850,1,
                              (char **)(auStack_14ad0 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_14ad0 + 0x18),(void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_14ad0._16_8_ = afStack_14a50[0].doc_count;
    auStack_14ad0._0_8_ = afStack_14a50[0].filename;
    auStack_14ad0._8_8_ = afStack_14a50[0].new_filename;
    info = (fdb_file_info *)auStack_14ae8;
    pfVar9 = pfStack_14af0;
    fVar1 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_14af0,(fdb_kvs_handle **)info,
                       (fdb_kvs_config *)auStack_14ad0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info = (fdb_file_info *)auStack_14ad8;
    kvs_config = (fdb_file_info *)auStack_14ad0;
    pfVar9 = pfStack_14af0;
    fVar1 = fdb_kvs_open((fdb_file_handle *)pfStack_14af0,(fdb_kvs_handle **)info,"db",
                         (fdb_kvs_config *)kvs_config);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar5 = 0;
    do {
      sprintf((char *)afStack_14a50,"key%06d",uVar5);
      sprintf((char *)afStack_14950,"body%06d",uVar5);
      pfVar9 = (fdb_kvs_handle *)auStack_14ae8._0_8_;
      sVar3 = strlen((char *)afStack_14a50);
      sVar4 = strlen((char *)afStack_14950);
      kvs_config = afStack_14950;
      info = afStack_14a50;
      fVar1 = fdb_set_kv(pfVar9,afStack_14a50,sVar3,afStack_14950,sVar4);
      handle = auStack_14ad8;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar3 = strlen((char *)afStack_14a50);
      sVar4 = strlen((char *)afStack_14950);
      kvs_config = afStack_14950;
      info = afStack_14a50;
      fVar1 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_14a50,sVar3,afStack_14950,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar9 = (fdb_kvs_handle *)handle;
        goto LAB_00110e9b;
      }
      uVar10 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar10;
    } while (uVar10 != 10000);
    kvs_config = (fdb_file_info *)auStack_14ad0;
    auStack_14ad0._8_8_ = _compact_test_keycmp;
    info = (fdb_file_info *)(auStack_14ae8 + 8);
    pfVar9 = pfStack_14af0;
    fVar1 = fdb_kvs_open((fdb_file_handle *)pfStack_14af0,(fdb_kvs_handle **)info,"db_custom",
                         (fdb_kvs_config *)kvs_config);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info = afStack_14a50;
    sprintf((char *)info,"key%06d",0);
    kvs_config = afStack_14950;
    sprintf((char *)kvs_config,"body%06d",0);
    sVar3 = strlen((char *)info);
    sVar4 = strlen((char *)kvs_config);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)auStack_14ae8._8_8_,info,sVar3,kvs_config,sVar4);
    pfVar9 = (fdb_kvs_handle *)auStack_14ae8._8_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info = (fdb_file_info *)0x0;
    pfVar9 = pfStack_14af0;
    fVar1 = fdb_commit((fdb_file_handle *)pfStack_14af0,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar5 = 0;
    uVar13 = 0;
    do {
      sprintf((char *)afStack_14a50,"key%06d",uVar13);
      sprintf((char *)afStack_14950,"body%06d",uVar13);
      pfVar9 = (fdb_kvs_handle *)auStack_14ae8._0_8_;
      sVar3 = strlen((char *)afStack_14a50);
      sVar4 = strlen((char *)afStack_14950);
      kvs_config = afStack_14950;
      info = afStack_14a50;
      fVar1 = fdb_set_kv(pfVar9,afStack_14a50,sVar3,afStack_14950,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info = (fdb_file_info *)(auStack_14ad0 + 0x28);
      pfVar9 = pfStack_14af0;
      fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14af0,info);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar5 < uStack_14a80) {
        uVar5 = uStack_14a80;
      }
      uVar10 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar10;
    } while (uVar10 != 10000);
    info = (fdb_file_info *)0x0;
    pfVar9 = pfStack_14af0;
    fVar1 = fdb_commit((fdb_file_handle *)pfStack_14af0,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info = (fdb_file_info *)(auStack_14ad0 + 0x28);
    pfVar9 = pfStack_14af0;
    fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14af0,info);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar5 < uStack_14a80) {
      uVar5 = uStack_14a80;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar5);
    do {
      sleep(1);
      info = (fdb_file_info *)(auStack_14ad0 + 0x28);
      pfVar9 = pfStack_14af0;
      fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14af0,
                                (fdb_file_info *)(auStack_14ad0 + 0x28));
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar5 <= uStack_14a80);
    fVar1 = fdb_close((fdb_file_handle *)pfStack_14af0);
    pfVar9 = pfStack_14af0;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_shutdown();
      pfVar9 = pfStack_14af0;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar8 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        iVar2 = fprintf(_stderr,pcVar8,"auto compaction with custom comparison function");
        return (void *)CONCAT44(extraout_var_01,iVar2);
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info != kvs_config) {
    __n = kvs_config;
    if (info < kvs_config) {
      __n = info;
    }
    uVar10 = memcmp(pfVar9,__s2,(size_t)__n);
    if (uVar10 == 0) {
      uVar10 = (int)info - (int)kvs_config;
    }
    return (void *)(ulong)uVar10;
  }
  iVar2 = memcmp(pfVar9,__s2,(size_t)info);
  return (void *)CONCAT44(extraout_var_02,iVar2);
}

Assistant:

void *db_compact_during_doc_delete(void *args)
{

    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 100;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_kvs_info kvs_info;
    thread_t tid;
    void *thread_ret;
    fdb_doc **doc = alca(fdb_doc*, n);
    char keybuf[256], metabuf[256], bodybuf[256];

    // init dbfile
    kvs_config = fdb_get_default_kvs_config();
    fconfig = fdb_get_default_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;

    if (args == NULL)
    { // parent

        r = system(SHELL_DEL" compact_test* > errorlog.txt");
        (void)r;

        status = fdb_open(&dbfile, "./compact_test1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // insert documents
        for (i=0;i<n;++i){
            sprintf(keybuf, "key%d", i);
            sprintf(metabuf, "meta%d", i);
            sprintf(bodybuf, "body%d", i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
            fdb_set(db, doc[i]);
        }

        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        // verify no docs remaining
        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == (uint64_t)n);

        // start deleting docs
        for (i=0;i<n;++i){
            fdb_del(db, doc[i]);
            if (i == n/2){
                // compact half-way
                thread_create(&tid, db_compact_during_doc_delete, (void *)dbfile);
            }
        }

        // join compactor
        thread_join(tid, &thread_ret);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

        // verify no docs remaining
        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == 0);

        // reopen
        fdb_kvs_close(db);
        fdb_close(dbfile);
        status = fdb_open(&dbfile, "./compact_test1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == 0);

        // cleanup
        for (i=0;i<n;++i){
            fdb_doc_free(doc[i]);
        }
        fdb_kvs_close(db);
        fdb_close(dbfile);
        fdb_shutdown();

        memleak_end();
        TEST_RESULT("multi thread client shutdown");
        return NULL;
    }

    // compaction thread enters here //
    status = fdb_open(&dbfile, "./compact_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_close(dbfile);

    // shutdown
    thread_exit(0);
    return NULL;
}